

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O3

StringRef __thiscall mp::internal::TextReader<fmt::Locale>::ReadName(TextReader<fmt::Locale> *this)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  StringRef SVar6;
  undefined8 local_48;
  undefined8 uStack_40;
  ArgList local_38;
  
  SkipSpace(this);
  pcVar2 = (this->super_ReaderBase).ptr_;
  if ((*pcVar2 == '\n') || (pcVar4 = pcVar2, *pcVar2 == '\0')) {
    local_48 = 0;
    uStack_40 = 0;
    local_38.types_ = 0;
    local_38.field_1.values_ = (Value *)&local_48;
    DoReportError(this,(this->super_ReaderBase).token_,(CStringRef)0x17783f,&local_38);
    pcVar4 = (this->super_ReaderBase).ptr_;
  }
  sVar5 = (long)pcVar4 - (long)pcVar2;
  do {
    pcVar4 = pcVar4 + 1;
    (this->super_ReaderBase).ptr_ = pcVar4;
    cVar1 = *pcVar4;
    iVar3 = isspace((int)cVar1);
    sVar5 = sVar5 + 1;
    if (cVar1 == '\0') break;
  } while (iVar3 == 0);
  SVar6.size_ = sVar5;
  SVar6.data_ = pcVar2;
  return SVar6;
}

Assistant:

fmt::StringRef mp::internal::TextReader<Locale>::ReadName() {
  SkipSpace();
  const char *start = ptr_;
  if (*ptr_ == '\n' || !*ptr_)
    ReportError("expected name");
  do ++ptr_;
  while (!std::isspace(*ptr_) && *ptr_);
  return fmt::StringRef(start, ptr_ - start);
}